

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O1

void merge_4way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
               uchar **from3,size_t n3,uchar **result)

{
  uchar **ppuVar1;
  int iVar2;
  ostream *poVar3;
  size_t n1_00;
  uchar *puVar4;
  uchar *__s2;
  uchar *puVar5;
  char *pcVar6;
  uchar *puVar7;
  long lVar8;
  uchar **local_70;
  uchar **local_68;
  uchar **local_60;
  uchar **local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"merge_4way",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(), n0=",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", n1=",5);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", n2=",5);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", n3=",5);
  local_48 = n3;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  puVar4 = *from0;
  if (puVar4 == (uchar *)0x0) goto LAB_00227b83;
  puVar5 = *from1;
  if (puVar5 != (uchar *)0x0) {
    local_70 = result;
    local_58 = from3;
    iVar2 = strcmp((char *)puVar4,(char *)puVar5);
    __s2 = *from2;
    local_68 = from2;
    local_40 = n2;
    local_60 = from0;
    local_50 = n1;
    if (iVar2 < 1) {
      if (__s2 != (uchar *)0x0) {
        iVar2 = strcmp((char *)puVar5,(char *)__s2);
        if (iVar2 < 1) {
          puVar7 = *from3;
          if (puVar7 != (uchar *)0x0) {
            iVar2 = strcmp((char *)puVar7,(char *)puVar4);
            if (-1 < iVar2) {
              iVar2 = strcmp((char *)puVar7,(char *)puVar5);
              if (iVar2 < 0) goto LAB_00225fae;
              iVar2 = strcmp((char *)puVar7,(char *)__s2);
              if (-1 < iVar2) goto LAB_00227acd;
              goto LAB_00227b3f;
            }
LAB_00225bef:
            lVar8 = 0;
            do {
              pcVar6 = *(char **)((long)local_58 + lVar8);
              if (pcVar6 == (char *)0x0) goto LAB_00227b83;
              puVar4 = *local_60;
              if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
              iVar2 = strcmp(pcVar6,(char *)puVar4);
              if (0 < iVar2) goto LAB_00227738;
              puVar5 = *from1;
              if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
              iVar2 = strcmp((char *)puVar4,(char *)puVar5);
              if (0 < iVar2) {
                pcVar6 = "cmp(*from0, *from1) <= 0";
                goto LAB_00227763;
              }
              if (*local_68 == (uchar *)0x0) goto LAB_00227b64;
              iVar2 = strcmp((char *)puVar5,(char *)*local_68);
              if (0 < iVar2) {
                pcVar6 = "cmp(*from1, *from2) <= 0";
                goto LAB_00227763;
              }
              *(char **)((long)local_70 + lVar8) = pcVar6;
              if (local_48 == 1) goto LAB_00227ad5;
              pcVar6 = *(char **)((long)local_58 + lVar8 + 8);
              if (pcVar6 == (char *)0x0) goto LAB_00227b83;
              if (*local_60 == (uchar *)0x0) goto LAB_00227b64;
              iVar2 = strcmp(pcVar6,(char *)*local_60);
              lVar8 = lVar8 + 8;
              local_48 = local_48 - 1;
            } while (iVar2 < 0);
            if (*from1 != (uchar *)0x0) {
              local_58 = (uchar **)((long)local_58 + lVar8);
              local_70 = (uchar **)((long)local_70 + lVar8);
              iVar2 = strcmp(pcVar6,(char *)*from1);
              if (iVar2 < 0) goto LAB_00225fae;
              if (*local_68 != (uchar *)0x0) {
                iVar2 = strcmp(pcVar6,(char *)*local_68);
                if (iVar2 < 0) goto LAB_00227b3f;
LAB_00227acd:
                lVar8 = 0;
                do {
                  pcVar6 = *(char **)((long)local_60 + lVar8);
                  if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                  puVar4 = *from1;
                  if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                  iVar2 = strcmp(pcVar6,(char *)puVar4);
                  if (0 < iVar2) goto LAB_00226e94;
                  puVar5 = *local_68;
                  if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                  iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                  if (0 < iVar2) {
                    pcVar6 = "cmp(*from1, *from2) <= 0";
                    goto LAB_00226e9b;
                  }
                  if (*local_58 == (uchar *)0x0) goto LAB_00227b64;
                  iVar2 = strcmp((char *)puVar5,(char *)*local_58);
                  if (0 < iVar2) {
                    pcVar6 = "cmp(*from2, *from3) <= 0";
                    goto LAB_00226e9b;
                  }
                  *(char **)((long)local_70 + lVar8) = pcVar6;
                  ppuVar1 = from1;
                  if (n0 == 1) goto LAB_00227711;
                  pcVar6 = *(char **)((long)local_60 + lVar8 + 8);
                  if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                  if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                  iVar2 = strcmp(pcVar6,(char *)*from1);
                  lVar8 = lVar8 + 8;
                  n0 = n0 - 1;
                } while (iVar2 < 1);
                if (*local_68 != (uchar *)0x0) {
                  local_60 = (uchar **)((long)local_60 + lVar8);
                  local_70 = (uchar **)((long)local_70 + lVar8);
                  iVar2 = strcmp(pcVar6,(char *)*local_68);
                  if (iVar2 < 1) goto LAB_0022687f;
                  if (*local_58 != (uchar *)0x0) {
                    iVar2 = strcmp(pcVar6,(char *)*local_58);
                    if (iVar2 < 1) goto LAB_002263b8;
LAB_00226d67:
                    lVar8 = 0;
                    do {
                      pcVar6 = *(char **)((long)from1 + lVar8);
                      if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                      puVar4 = *local_68;
                      if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                      iVar2 = strcmp(pcVar6,(char *)puVar4);
                      if (0 < iVar2) {
                        pcVar6 = "cmp(*from1, *from2) <= 0";
                        goto LAB_00226eb3;
                      }
                      puVar5 = *local_58;
                      if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                      iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                      if (0 < iVar2) {
                        pcVar6 = "cmp(*from2, *from3) <= 0";
                        goto LAB_00226eb3;
                      }
                      if (*local_60 == (uchar *)0x0) goto LAB_00227b64;
                      iVar2 = strcmp((char *)puVar5,(char *)*local_60);
                      if (0 < iVar2) goto LAB_002270f3;
                      *(char **)((long)local_70 + lVar8) = pcVar6;
                      if (local_50 == 1) goto LAB_00227232;
                      pcVar6 = *(char **)((long)from1 + lVar8 + 8);
                      if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                      if (*local_68 == (uchar *)0x0) goto LAB_00227b64;
                      iVar2 = strcmp(pcVar6,(char *)*local_68);
                      lVar8 = lVar8 + 8;
                      local_50 = local_50 - 1;
                    } while (iVar2 < 1);
                    if (*local_58 != (uchar *)0x0) {
                      from1 = (uchar **)((long)from1 + lVar8);
                      local_70 = (uchar **)((long)local_70 + lVar8);
                      iVar2 = strcmp(pcVar6,(char *)*local_58);
                      if (iVar2 < 1) goto LAB_00227391;
                      if (*local_60 != (uchar *)0x0) {
                        iVar2 = strcmp(pcVar6,(char *)*local_60);
                        if (iVar2 < 0) goto LAB_002260de;
LAB_002277a2:
                        lVar8 = 0;
                        do {
                          pcVar6 = *(char **)((long)local_68 + lVar8);
                          if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                          puVar4 = *local_58;
                          if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                          iVar2 = strcmp(pcVar6,(char *)puVar4);
                          if (0 < iVar2) goto LAB_00227ba2;
                          puVar5 = *local_60;
                          if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                          iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                          if (0 < iVar2) goto LAB_00227bb4;
                          if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                          iVar2 = strcmp((char *)puVar5,(char *)*from1);
                          if (0 < iVar2) {
                            pcVar6 = "cmp(*from0, *from1) <= 0";
                            goto LAB_00227bd6;
                          }
                          *(char **)((long)local_70 + lVar8) = pcVar6;
                          if (local_40 == 1) goto LAB_00227b01;
                          pcVar6 = *(char **)((long)local_68 + lVar8 + 8);
                          if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                          if (*local_58 == (uchar *)0x0) goto LAB_00227b64;
                          iVar2 = strcmp(pcVar6,(char *)*local_58);
                          lVar8 = lVar8 + 8;
                          local_40 = local_40 - 1;
                        } while (iVar2 < 1);
                        if (*local_60 != (uchar *)0x0) {
                          local_68 = (uchar **)((long)local_68 + lVar8);
                          local_70 = (uchar **)((long)local_70 + lVar8);
                          iVar2 = strcmp(pcVar6,(char *)*local_60);
                          if (iVar2 < 0) goto LAB_0022789f;
                          if (*from1 != (uchar *)0x0) {
                            iVar2 = strcmp(pcVar6,(char *)*from1);
                            if (iVar2 < 0) {
LAB_002274de:
                              lVar8 = 0;
                              do {
                                pcVar6 = *(char **)((long)local_58 + lVar8);
                                if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                puVar4 = *local_60;
                                if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                iVar2 = strcmp(pcVar6,(char *)puVar4);
                                if (0 < iVar2) goto LAB_00227738;
                                puVar5 = *local_68;
                                if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                if (0 < iVar2) goto LAB_00227741;
                                if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                iVar2 = strcmp((char *)puVar5,(char *)*from1);
                                if (0 < iVar2) {
                                  pcVar6 = "cmp(*from2, *from1) <= 0";
                                  goto LAB_00227763;
                                }
                                *(char **)((long)local_70 + lVar8) = pcVar6;
                                if (local_48 == 1) goto LAB_00227ad5;
                                puVar7 = *(uchar **)((long)local_58 + lVar8 + 8);
                                if (puVar7 == (uchar *)0x0) goto LAB_00227b83;
                                if (*local_60 == (uchar *)0x0) goto LAB_00227b64;
                                iVar2 = strcmp((char *)puVar7,(char *)*local_60);
                                lVar8 = lVar8 + 8;
                                local_48 = local_48 - 1;
                              } while (iVar2 < 0);
                              if (*local_68 != (uchar *)0x0) {
                                local_58 = (uchar **)((long)local_58 + lVar8);
                                local_70 = (uchar **)((long)local_70 + lVar8);
                                iVar2 = strcmp((char *)puVar7,(char *)*local_68);
                                if (iVar2 < 0) goto LAB_0022660f;
                                puVar5 = *from1;
                                if (puVar5 != (uchar *)0x0) {
LAB_002275ea:
                                  iVar2 = strcmp((char *)puVar7,(char *)puVar5);
                                  if (-1 < iVar2) goto LAB_0022779a;
LAB_002275f7:
                                  lVar8 = 0;
                                  do {
                                    pcVar6 = *(char **)((long)local_60 + lVar8);
                                    if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                    puVar4 = *local_68;
                                    if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                    iVar2 = strcmp(pcVar6,(char *)puVar4);
                                    if (0 < iVar2) {
                                      pcVar6 = "cmp(*from0, *from2) <= 0";
                                      goto LAB_00227782;
                                    }
                                    puVar5 = *local_58;
                                    if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                    iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                    if (0 < iVar2) {
                                      pcVar6 = "cmp(*from2, *from3) <= 0";
                                      goto LAB_00227782;
                                    }
                                    if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                    iVar2 = strcmp((char *)puVar5,(char *)*from1);
                                    if (0 < iVar2) goto LAB_0022774a;
                                    *(char **)((long)local_70 + lVar8) = pcVar6;
                                    ppuVar1 = from1;
                                    if (n0 == 1) goto LAB_00227711;
                                    pcVar6 = *(char **)((long)local_60 + lVar8 + 8);
                                    if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                    if (*local_68 == (uchar *)0x0) goto LAB_00227b64;
                                    iVar2 = strcmp(pcVar6,(char *)*local_68);
                                    lVar8 = lVar8 + 8;
                                    n0 = n0 - 1;
                                  } while (iVar2 < 1);
                                  if (*local_58 != (uchar *)0x0) {
                                    local_60 = (uchar **)((long)local_60 + lVar8);
                                    local_70 = (uchar **)((long)local_70 + lVar8);
                                    iVar2 = strcmp(pcVar6,(char *)*local_58);
                                    if (iVar2 < 1) goto LAB_002264e8;
                                    if (*from1 != (uchar *)0x0) {
                                      iVar2 = strcmp(pcVar6,(char *)*from1);
                                      if (0 < iVar2) {
LAB_002260de:
                                        lVar8 = 0;
                                        do {
                                          pcVar6 = *(char **)((long)local_68 + lVar8);
                                          if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                          puVar4 = *local_58;
                                          if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                          iVar2 = strcmp(pcVar6,(char *)puVar4);
                                          if (0 < iVar2) goto LAB_00227ba2;
                                          puVar5 = *from1;
                                          if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                          iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                          if (0 < iVar2) {
                                            pcVar6 = "cmp(*from3, *from1) <= 0";
                                            goto LAB_00227bd6;
                                          }
                                          if (*local_60 == (uchar *)0x0) goto LAB_00227b64;
                                          iVar2 = strcmp((char *)puVar5,(char *)*local_60);
                                          if (0 < iVar2) {
                                            pcVar6 = "cmp(*from1, *from0) <= 0";
                                            goto LAB_00227bd6;
                                          }
                                          *(char **)((long)local_70 + lVar8) = pcVar6;
                                          if (local_40 == 1) goto LAB_00227b01;
                                          pcVar6 = *(char **)((long)local_68 + lVar8 + 8);
                                          if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                          if (*local_58 == (uchar *)0x0) goto LAB_00227b64;
                                          iVar2 = strcmp(pcVar6,(char *)*local_58);
                                          lVar8 = lVar8 + 8;
                                          local_40 = local_40 - 1;
                                        } while (iVar2 < 1);
                                        if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                        local_68 = (uchar **)((long)local_68 + lVar8);
                                        local_70 = (uchar **)((long)local_70 + lVar8);
                                        iVar2 = strcmp(pcVar6,(char *)*from1);
                                        if (iVar2 < 0) goto LAB_00225e06;
                                        if (*local_60 == (uchar *)0x0) goto LAB_00227b64;
                                        iVar2 = strcmp(pcVar6,(char *)*local_60);
                                        if (iVar2 < 0) goto LAB_00226286;
LAB_0022674d:
                                        do {
                                          lVar8 = 0;
                                          do {
                                            pcVar6 = *(char **)((long)local_58 + lVar8);
                                            if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                            puVar4 = *from1;
                                            if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                            iVar2 = strcmp(pcVar6,(char *)puVar4);
                                            if (0 < iVar2) {
                                              pcVar6 = "cmp(*from3, *from1) <= 0";
                                              goto LAB_00227763;
                                            }
                                            puVar5 = *local_60;
                                            if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                            iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                            if (0 < iVar2) {
                                              pcVar6 = "cmp(*from1, *from0) <= 0";
                                              goto LAB_00227763;
                                            }
                                            if (*local_68 == (uchar *)0x0) goto LAB_00227b64;
                                            iVar2 = strcmp((char *)puVar5,(char *)*local_68);
                                            if (0 < iVar2) goto LAB_00227741;
                                            *(char **)((long)local_70 + lVar8) = pcVar6;
                                            if (local_48 == 1) goto LAB_00227ad5;
                                            puVar7 = *(uchar **)((long)local_58 + lVar8 + 8);
                                            if (puVar7 == (uchar *)0x0) goto LAB_00227b83;
                                            if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                            iVar2 = strcmp((char *)puVar7,(char *)*from1);
                                            lVar8 = lVar8 + 8;
                                            local_48 = local_48 - 1;
                                          } while (iVar2 < 0);
                                          if (*local_60 == (uchar *)0x0) goto LAB_00227b64;
                                          local_58 = (uchar **)((long)local_58 + lVar8);
                                          local_70 = (uchar **)((long)local_70 + lVar8);
                                          iVar2 = strcmp((char *)puVar7,(char *)*local_60);
                                          if (-1 < iVar2) {
                                            __s2 = *local_68;
                                            if (__s2 != (uchar *)0x0) {
LAB_00226858:
                                              iVar2 = strcmp((char *)puVar7,(char *)__s2);
                                              if (iVar2 < 0) goto LAB_00226af0;
LAB_0022687f:
                                              lVar8 = 0;
                                              do {
                                                pcVar6 = *(char **)((long)from1 + lVar8);
                                                if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                puVar4 = *local_60;
                                                if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                                iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                if (0 < iVar2) goto LAB_00226c0b;
                                                puVar5 = *local_68;
                                                if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                                iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                                if (0 < iVar2) {
                                                  pcVar6 = "cmp(*from0, *from2) <= 0";
                                                  goto LAB_00226c24;
                                                }
                                                if (*local_58 == (uchar *)0x0) goto LAB_00227b64;
                                                iVar2 = strcmp((char *)puVar5,(char *)*local_58);
                                                if (0 < iVar2) {
                                                  pcVar6 = "cmp(*from2, *from3) <= 0";
                                                  goto LAB_00226c24;
                                                }
                                                *(char **)((long)local_70 + lVar8) = pcVar6;
                                                if (local_50 == 1) goto LAB_00227232;
                                                pcVar6 = *(char **)((long)from1 + lVar8 + 8);
                                                if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                if (*local_60 == (uchar *)0x0) goto LAB_00227b64;
                                                iVar2 = strcmp(pcVar6,(char *)*local_60);
                                                lVar8 = lVar8 + 8;
                                                local_50 = local_50 - 1;
                                              } while (iVar2 < 0);
                                              if (*local_68 != (uchar *)0x0) {
                                                from1 = (uchar **)((long)from1 + lVar8);
                                                local_70 = (uchar **)((long)local_70 + lVar8);
                                                iVar2 = strcmp(pcVar6,(char *)*local_68);
                                                if (0 < iVar2) {
                                                  if (*local_58 != (uchar *)0x0) {
                                                    iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                    if (iVar2 < 1) {
LAB_0022779a:
                                                      lVar8 = 0;
                                                      do {
                                                        pcVar6 = *(char **)((long)local_60 + lVar8);
                                                        if (pcVar6 == (char *)0x0)
                                                        goto LAB_00227b83;
                                                        puVar4 = *local_68;
                                                        if (puVar4 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                        if (0 < iVar2) {
                                                          pcVar6 = "cmp(*from0, *from2) <= 0";
                                                          goto LAB_00226e9b;
                                                        }
                                                        puVar5 = *from1;
                                                        if (puVar5 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp((char *)puVar4,(char *)puVar5
                                                                      );
                                                        if (0 < iVar2) {
                                                          pcVar6 = "cmp(*from2, *from1) <= 0";
                                                          goto LAB_00226e9b;
                                                        }
                                                        if (*local_58 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp((char *)puVar5,
                                                                       (char *)*local_58);
                                                        if (0 < iVar2) goto LAB_00227273;
                                                        *(char **)((long)local_70 + lVar8) = pcVar6;
                                                        ppuVar1 = from1;
                                                        if (n0 == 1) goto LAB_00227711;
                                                        pcVar6 = *(char **)((long)local_60 +
                                                                           lVar8 + 8);
                                                        if (pcVar6 == (char *)0x0)
                                                        goto LAB_00227b83;
                                                        if (*local_68 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp(pcVar6,(char *)*local_68);
                                                        lVar8 = lVar8 + 8;
                                                        n0 = n0 - 1;
                                                      } while (iVar2 < 1);
                                                      if (*from1 != (uchar *)0x0) {
                                                        local_60 = (uchar **)
                                                                   ((long)local_60 + lVar8);
                                                        local_70 = (uchar **)
                                                                   ((long)local_70 + lVar8);
                                                        iVar2 = strcmp(pcVar6,(char *)*from1);
                                                        if (iVar2 < 1) goto LAB_002279b8;
                                                        if (*local_58 != (uchar *)0x0) {
                                                          iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                          if (iVar2 < 1) goto LAB_002269b2;
LAB_00227391:
                                                          lVar8 = 0;
                                                          do {
                                                            pcVar6 = *(char **)((long)local_68 +
                                                                               lVar8);
                                                            if (pcVar6 == (char *)0x0)
                                                            goto LAB_00227b83;
                                                            puVar4 = *from1;
                                                            if (puVar4 == (uchar *)0x0)
                                                            goto LAB_00227b64;
                                                            iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                            if (0 < iVar2) {
                                                              pcVar6 = "cmp(*from2, *from1) <= 0";
                                                              goto LAB_00227bd6;
                                                            }
                                                            puVar5 = *local_58;
                                                            if (puVar5 == (uchar *)0x0)
                                                            goto LAB_00227b64;
                                                            iVar2 = strcmp((char *)puVar4,
                                                                           (char *)puVar5);
                                                            if (0 < iVar2) {
                                                              pcVar6 = "cmp(*from1, *from3) <= 0";
                                                              goto LAB_00227bd6;
                                                            }
                                                            if (*local_60 == (uchar *)0x0)
                                                            goto LAB_00227b64;
                                                            iVar2 = strcmp((char *)puVar5,
                                                                           (char *)*local_60);
                                                            if (0 < iVar2) goto LAB_00227bb4;
                                                            *(char **)((long)local_70 + lVar8) =
                                                                 pcVar6;
                                                            if (local_40 == 1) goto LAB_00227b01;
                                                            pcVar6 = *(char **)((long)local_68 +
                                                                               lVar8 + 8);
                                                            if (pcVar6 == (char *)0x0)
                                                            goto LAB_00227b83;
                                                            if (*from1 == (uchar *)0x0)
                                                            goto LAB_00227b64;
                                                            iVar2 = strcmp(pcVar6,(char *)*from1);
                                                            lVar8 = lVar8 + 8;
                                                            local_40 = local_40 - 1;
                                                          } while (iVar2 < 0);
                                                          if (*local_58 != (uchar *)0x0) {
                                                            local_68 = (uchar **)
                                                                       ((long)local_68 + lVar8);
                                                            local_70 = (uchar **)
                                                                       ((long)local_70 + lVar8);
                                                            iVar2 = strcmp(pcVar6,(char *)*local_58)
                                                            ;
                                                            if (0 < iVar2) {
                                                              if (*local_60 != (uchar *)0x0) {
                                                                iVar2 = strcmp(pcVar6,(char *)*
                                                  local_60);
                                                  if (iVar2 < 0) {
LAB_00227117:
                                                    do {
                                                      lVar8 = 0;
                                                      do {
                                                        pcVar6 = *(char **)((long)from1 + lVar8);
                                                        if (pcVar6 == (char *)0x0)
                                                        goto LAB_00227b83;
                                                        puVar4 = *local_58;
                                                        if (puVar4 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                        if (0 < iVar2) goto LAB_0022724f;
                                                        puVar5 = *local_68;
                                                        if (puVar5 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp((char *)puVar4,(char *)puVar5
                                                                      );
                                                        if (0 < iVar2) {
                                                          pcVar6 = "cmp(*from3, *from2) <= 0";
                                                          goto LAB_00226eb3;
                                                        }
                                                        if (*local_60 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp((char *)puVar5,
                                                                       (char *)*local_60);
                                                        if (0 < iVar2) {
                                                          pcVar6 = "cmp(*from2, *from0) <= 0";
                                                          goto LAB_00226eb3;
                                                        }
                                                        *(char **)((long)local_70 + lVar8) = pcVar6;
                                                        if (local_50 == 1) goto LAB_00227232;
                                                        pcVar6 = *(char **)((long)from1 + lVar8 + 8)
                                                        ;
                                                        if (pcVar6 == (char *)0x0)
                                                        goto LAB_00227b83;
                                                        if (*local_58 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                        lVar8 = lVar8 + 8;
                                                        local_50 = local_50 - 1;
                                                      } while (iVar2 < 1);
                                                      if (*local_68 == (uchar *)0x0)
                                                      goto LAB_00227b64;
                                                      from1 = (uchar **)((long)from1 + lVar8);
                                                      local_70 = (uchar **)((long)local_70 + lVar8);
                                                      iVar2 = strcmp(pcVar6,(char *)*local_68);
                                                      if (iVar2 < 1) goto LAB_00226286;
                                                      if (*local_60 == (uchar *)0x0)
                                                      goto LAB_00227b64;
                                                      iVar2 = strcmp(pcVar6,(char *)*local_60);
                                                      if (-1 < iVar2) goto LAB_0022789f;
LAB_00225e06:
                                                      lVar8 = 0;
                                                      do {
                                                        pcVar6 = *(char **)((long)local_58 + lVar8);
                                                        if (pcVar6 == (char *)0x0)
                                                        goto LAB_00227b83;
                                                        puVar4 = *local_68;
                                                        if (puVar4 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                        if (0 < iVar2) goto LAB_00227bab;
                                                        puVar5 = *from1;
                                                        if (puVar5 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp((char *)puVar4,(char *)puVar5
                                                                      );
                                                        if (0 < iVar2) {
                                                          pcVar6 = "cmp(*from2, *from1) <= 0";
                                                          goto LAB_00227bf5;
                                                        }
                                                        if (*local_60 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp((char *)puVar5,
                                                                       (char *)*local_60);
                                                        if (0 < iVar2) {
                                                          pcVar6 = "cmp(*from1, *from0) <= 0";
                                                          goto LAB_00227bf5;
                                                        }
                                                        *(char **)((long)local_70 + lVar8) = pcVar6;
                                                        if (local_48 == 1) goto LAB_00227ad5;
                                                        pcVar6 = *(char **)((long)local_58 +
                                                                           lVar8 + 8);
                                                        if (pcVar6 == (char *)0x0)
                                                        goto LAB_00227b83;
                                                        if (*local_68 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp(pcVar6,(char *)*local_68);
                                                        lVar8 = lVar8 + 8;
                                                        local_48 = local_48 - 1;
                                                      } while (iVar2 < 0);
                                                      if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                      local_58 = (uchar **)((long)local_58 + lVar8);
                                                      local_70 = (uchar **)((long)local_70 + lVar8);
                                                      iVar2 = strcmp(pcVar6,(char *)*from1);
                                                      if (iVar2 < 0) goto LAB_002260de;
                                                      if (*local_60 == (uchar *)0x0)
                                                      goto LAB_00227b64;
                                                      iVar2 = strcmp(pcVar6,(char *)*local_60);
joined_r0x00226227:
                                                      if (iVar2 < 0) goto LAB_00227391;
LAB_002269b2:
                                                      lVar8 = 0;
                                                      do {
                                                        pcVar6 = *(char **)((long)local_68 + lVar8);
                                                        if (pcVar6 == (char *)0x0)
                                                        goto LAB_00227b83;
                                                        puVar4 = *from1;
                                                        if (puVar4 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                        if (0 < iVar2) {
                                                          pcVar6 = "cmp(*from2, *from1) <= 0";
                                                          goto LAB_00227c1d;
                                                        }
                                                        puVar5 = *local_60;
                                                        if (puVar5 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp((char *)puVar4,(char *)puVar5
                                                                      );
                                                        if (0 < iVar2) {
                                                          pcVar6 = "cmp(*from1, *from0) <= 0";
                                                          goto LAB_00227c1d;
                                                        }
                                                        if (*local_58 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp((char *)puVar5,
                                                                       (char *)*local_58);
                                                        if (0 < iVar2) goto LAB_00226acc;
                                                        *(char **)((long)local_70 + lVar8) = pcVar6;
                                                        if (local_40 == 1) goto LAB_00227b01;
                                                        pcVar6 = *(char **)((long)local_68 +
                                                                           lVar8 + 8);
                                                        if (pcVar6 == (char *)0x0)
                                                        goto LAB_00227b83;
                                                        if (*from1 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        iVar2 = strcmp(pcVar6,(char *)*from1);
                                                        lVar8 = lVar8 + 8;
                                                        local_40 = local_40 - 1;
                                                      } while (iVar2 < 0);
                                                      if (*local_60 == (uchar *)0x0)
                                                      goto LAB_00227b64;
                                                      local_68 = (uchar **)((long)local_68 + lVar8);
                                                      local_70 = (uchar **)((long)local_70 + lVar8);
                                                      iVar2 = strcmp(pcVar6,(char *)*local_60);
                                                      if (iVar2 < 0) goto LAB_002263b8;
                                                      if (*local_58 == (uchar *)0x0)
                                                      goto LAB_00227b64;
                                                      iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                      if (iVar2 < 1) goto LAB_0022687f;
LAB_00226af0:
                                                      do {
                                                        lVar8 = 0;
                                                        do {
                                                          pcVar6 = *(char **)((long)from1 + lVar8);
                                                          if (pcVar6 == (char *)0x0)
                                                          goto LAB_00227b83;
                                                          puVar4 = *local_60;
                                                          if (puVar4 == (uchar *)0x0)
                                                          goto LAB_00227b64;
                                                          iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                          if (0 < iVar2) goto LAB_00226c0b;
                                                          puVar5 = *local_58;
                                                          if (puVar5 == (uchar *)0x0)
                                                          goto LAB_00227b64;
                                                          iVar2 = strcmp((char *)puVar4,
                                                                         (char *)puVar5);
                                                          if (0 < iVar2) goto LAB_00226c14;
                                                          if (*local_68 == (uchar *)0x0)
                                                          goto LAB_00227b64;
                                                          iVar2 = strcmp((char *)puVar5,
                                                                         (char *)*local_68);
                                                          if (0 < iVar2) {
                                                            pcVar6 = "cmp(*from3, *from2) <= 0";
                                                            goto LAB_00226c24;
                                                          }
                                                          *(char **)((long)local_70 + lVar8) =
                                                               pcVar6;
                                                          if (local_50 == 1) goto LAB_00227232;
                                                          pcVar6 = *(char **)((long)from1 +
                                                                             lVar8 + 8);
                                                          if (pcVar6 == (char *)0x0)
                                                          goto LAB_00227b83;
                                                          if (*local_60 == (uchar *)0x0)
                                                          goto LAB_00227b64;
                                                          iVar2 = strcmp(pcVar6,(char *)*local_60);
                                                          lVar8 = lVar8 + 8;
                                                          local_50 = local_50 - 1;
                                                        } while (iVar2 < 0);
                                                        if (*local_58 == (uchar *)0x0)
                                                        goto LAB_00227b64;
                                                        from1 = (uchar **)((long)from1 + lVar8);
                                                        local_70 = (uchar **)
                                                                   ((long)local_70 + lVar8);
                                                        iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                        if (0 < iVar2) {
                                                          if (*local_68 == (uchar *)0x0)
                                                          goto LAB_00227b64;
                                                          iVar2 = strcmp(pcVar6,(char *)*local_68);
                                                          if (0 < iVar2) goto LAB_0022660f;
LAB_00225fae:
                                                          while( true ) {
                                                            lVar8 = 0;
                                                            do {
                                                              pcVar6 = *(char **)((long)local_60 +
                                                                                 lVar8);
                                                              if (pcVar6 == (char *)0x0)
                                                              goto LAB_00227b83;
                                                              puVar4 = *local_58;
                                                              if (puVar4 == (uchar *)0x0)
                                                              goto LAB_00227b64;
                                                              iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                              if (0 < iVar2) goto LAB_00226729;
                                                              puVar5 = *from1;
                                                              if (puVar5 == (uchar *)0x0)
                                                              goto LAB_00227b64;
                                                              iVar2 = strcmp((char *)puVar4,
                                                                             (char *)puVar5);
                                                              if (0 < iVar2) goto LAB_0022774a;
                                                              if (*local_68 == (uchar *)0x0)
                                                              goto LAB_00227b64;
                                                              iVar2 = strcmp((char *)puVar5,
                                                                             (char *)*local_68);
                                                              if (0 < iVar2) {
                                                                pcVar6 = "cmp(*from1, *from2) <= 0";
                                                                goto LAB_00227782;
                                                              }
                                                              *(char **)((long)local_70 + lVar8) =
                                                                   pcVar6;
                                                              ppuVar1 = from1;
                                                              if (n0 == 1) goto LAB_00227711;
                                                              pcVar6 = *(char **)((long)local_60 +
                                                                                 lVar8 + 8);
                                                              if (pcVar6 == (char *)0x0)
                                                              goto LAB_00227b83;
                                                              if (*local_58 == (uchar *)0x0)
                                                              goto LAB_00227b64;
                                                              iVar2 = strcmp(pcVar6,(char *)*
                                                  local_58);
                                                  lVar8 = lVar8 + 8;
                                                  n0 = n0 - 1;
                                                  } while (iVar2 < 1);
                                                  if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                  local_60 = (uchar **)((long)local_60 + lVar8);
                                                  local_70 = (uchar **)((long)local_70 + lVar8);
                                                  iVar2 = strcmp(pcVar6,(char *)*from1);
                                                  if (iVar2 < 1) goto LAB_00225bef;
                                                  if (*local_68 == (uchar *)0x0) goto LAB_00227b64;
                                                  iVar2 = strcmp(pcVar6,(char *)*local_68);
                                                  if (iVar2 < 1) goto LAB_0022674d;
LAB_00226286:
                                                  lVar8 = 0;
                                                  do {
                                                    pcVar6 = *(char **)((long)local_58 + lVar8);
                                                    if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                    puVar4 = *from1;
                                                    if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                    if (0 < iVar2) {
                                                      pcVar6 = "cmp(*from3, *from1) <= 0";
                                                      goto LAB_00227bf5;
                                                    }
                                                    puVar5 = *local_68;
                                                    if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                                    if (0 < iVar2) {
                                                      pcVar6 = "cmp(*from1, *from2) <= 0";
                                                      goto LAB_00227bf5;
                                                    }
                                                    if (*local_60 == (uchar *)0x0)
                                                    goto LAB_00227b64;
                                                    iVar2 = strcmp((char *)puVar5,(char *)*local_60)
                                                    ;
                                                    if (0 < iVar2) goto LAB_00227bbd;
                                                    *(char **)((long)local_70 + lVar8) = pcVar6;
                                                    if (local_48 == 1) goto LAB_00227ad5;
                                                    puVar7 = *(uchar **)((long)local_58 + lVar8 + 8)
                                                    ;
                                                    if (puVar7 == (uchar *)0x0) goto LAB_00227b83;
                                                    if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp((char *)puVar7,(char *)*from1);
                                                    lVar8 = lVar8 + 8;
                                                    local_48 = local_48 - 1;
                                                  } while (iVar2 < 0);
                                                  if (*local_68 == (uchar *)0x0) goto LAB_00227b64;
                                                  local_58 = (uchar **)((long)local_58 + lVar8);
                                                  local_70 = (uchar **)((long)local_70 + lVar8);
                                                  iVar2 = strcmp((char *)puVar7,(char *)*local_68);
                                                  if (iVar2 < 0) goto LAB_00227117;
                                                  puVar4 = *local_60;
                                                  if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
LAB_00226391:
                                                  iVar2 = strcmp((char *)puVar7,(char *)puVar4);
                                                  if (iVar2 < 0) goto LAB_00226d67;
LAB_002263b8:
                                                  lVar8 = 0;
                                                  do {
                                                    pcVar6 = *(char **)((long)from1 + lVar8);
                                                    if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                    puVar4 = *local_68;
                                                    if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                    if (0 < iVar2) {
                                                      pcVar6 = "cmp(*from1, *from2) <= 0";
                                                      goto LAB_00226c24;
                                                    }
                                                    puVar5 = *local_60;
                                                    if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                                    if (0 < iVar2) {
                                                      pcVar6 = "cmp(*from2, *from0) <= 0";
                                                      goto LAB_00226c24;
                                                    }
                                                    if (*local_58 == (uchar *)0x0)
                                                    goto LAB_00227b64;
                                                    iVar2 = strcmp((char *)puVar5,(char *)*local_58)
                                                    ;
                                                    if (0 < iVar2) goto LAB_00226c14;
                                                    *(char **)((long)local_70 + lVar8) = pcVar6;
                                                    if (local_50 == 1) goto LAB_00227232;
                                                    pcVar6 = *(char **)((long)from1 + lVar8 + 8);
                                                    if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                    if (*local_68 == (uchar *)0x0)
                                                    goto LAB_00227b64;
                                                    iVar2 = strcmp(pcVar6,(char *)*local_68);
                                                    lVar8 = lVar8 + 8;
                                                    local_50 = local_50 - 1;
                                                  } while (iVar2 < 1);
                                                  if (*local_60 == (uchar *)0x0) goto LAB_00227b64;
                                                  from1 = (uchar **)((long)from1 + lVar8);
                                                  local_70 = (uchar **)((long)local_70 + lVar8);
                                                  iVar2 = strcmp(pcVar6,(char *)*local_60);
                                                  if (iVar2 < 0) goto LAB_002269b2;
                                                  if (*local_58 == (uchar *)0x0) goto LAB_00227b64;
                                                  iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                  if (iVar2 < 1) break;
LAB_002264e8:
                                                  while( true ) {
                                                    lVar8 = 0;
                                                    do {
                                                      pcVar6 = *(char **)((long)local_68 + lVar8);
                                                      if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                      puVar4 = *local_60;
                                                      if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                                      iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                      if (0 < iVar2) goto LAB_00227bc6;
                                                      puVar5 = *local_58;
                                                      if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                                      iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                                      if (0 < iVar2) goto LAB_00226acc;
                                                      if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                      iVar2 = strcmp((char *)puVar5,(char *)*from1);
                                                      if (0 < iVar2) {
                                                        pcVar6 = "cmp(*from3, *from1) <= 0";
                                                        goto LAB_00227c1d;
                                                      }
                                                      *(char **)((long)local_70 + lVar8) = pcVar6;
                                                      if (local_40 == 1) goto LAB_00227b01;
                                                      pcVar6 = *(char **)((long)local_68 + lVar8 + 8
                                                                         );
                                                      if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                      if (*local_60 == (uchar *)0x0)
                                                      goto LAB_00227b64;
                                                      iVar2 = strcmp(pcVar6,(char *)*local_60);
                                                      lVar8 = lVar8 + 8;
                                                      local_40 = local_40 - 1;
                                                    } while (iVar2 < 0);
                                                    if (*local_58 == (uchar *)0x0)
                                                    goto LAB_00227b64;
                                                    local_68 = (uchar **)((long)local_68 + lVar8);
                                                    local_70 = (uchar **)((long)local_70 + lVar8);
                                                    iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                    if (iVar2 < 1) goto LAB_002275f7;
                                                    if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp(pcVar6,(char *)*from1);
                                                    if (-1 < iVar2) break;
LAB_0022660f:
                                                    lVar8 = 0;
                                                    do {
                                                      pcVar6 = *(char **)((long)local_60 + lVar8);
                                                      if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                      puVar4 = *local_58;
                                                      if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                                      iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                      if (0 < iVar2) goto LAB_00226729;
                                                      puVar5 = *local_68;
                                                      if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                                      iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                                      if (0 < iVar2) {
                                                        pcVar6 = "cmp(*from3, *from2) <= 0";
                                                        goto LAB_00227782;
                                                      }
                                                      if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                      iVar2 = strcmp((char *)puVar5,(char *)*from1);
                                                      if (0 < iVar2) {
                                                        pcVar6 = "cmp(*from2, *from1) <= 0";
                                                        goto LAB_00227782;
                                                      }
                                                      *(char **)((long)local_70 + lVar8) = pcVar6;
                                                      ppuVar1 = from1;
                                                      if (n0 == 1) goto LAB_00227711;
                                                      pcVar6 = *(char **)((long)local_60 + lVar8 + 8
                                                                         );
                                                      if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                      if (*local_58 == (uchar *)0x0)
                                                      goto LAB_00227b64;
                                                      iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                      lVar8 = lVar8 + 8;
                                                      n0 = n0 - 1;
                                                    } while (iVar2 < 1);
                                                    if (*local_68 == (uchar *)0x0)
                                                    goto LAB_00227b64;
                                                    local_60 = (uchar **)((long)local_60 + lVar8);
                                                    local_70 = (uchar **)((long)local_70 + lVar8);
                                                    iVar2 = strcmp(pcVar6,(char *)*local_68);
                                                    if (iVar2 < 1) goto LAB_002274de;
                                                    if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp(pcVar6,(char *)*from1);
                                                    if (0 < iVar2) goto LAB_00225e06;
LAB_0022789f:
                                                    lVar8 = 0;
                                                    do {
                                                      pcVar6 = *(char **)((long)local_58 + lVar8);
                                                      if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                      puVar4 = *local_68;
                                                      if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                                      iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                      if (0 < iVar2) goto LAB_00227bab;
                                                      puVar5 = *local_60;
                                                      if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                                      iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                                      if (0 < iVar2) goto LAB_00227bbd;
                                                      if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                      iVar2 = strcmp((char *)puVar5,(char *)*from1);
                                                      if (0 < iVar2) {
                                                        pcVar6 = "cmp(*from0, *from1) <= 0";
                                                        goto LAB_00227bf5;
                                                      }
                                                      *(char **)((long)local_70 + lVar8) = pcVar6;
                                                      if (local_48 == 1) goto LAB_00227ad5;
                                                      puVar7 = *(uchar **)
                                                                ((long)local_58 + lVar8 + 8);
                                                      if (puVar7 == (uchar *)0x0) goto LAB_00227b83;
                                                      if (*local_68 == (uchar *)0x0)
                                                      goto LAB_00227b64;
                                                      iVar2 = strcmp((char *)puVar7,
                                                                     (char *)*local_68);
                                                      lVar8 = lVar8 + 8;
                                                      local_48 = local_48 - 1;
                                                    } while (iVar2 < 0);
                                                    if (*local_60 == (uchar *)0x0)
                                                    goto LAB_00227b64;
                                                    local_58 = (uchar **)((long)local_58 + lVar8);
                                                    local_70 = (uchar **)((long)local_70 + lVar8);
                                                    iVar2 = strcmp((char *)puVar7,(char *)*local_60)
                                                    ;
                                                    if (iVar2 < 0) goto LAB_002277a2;
                                                    puVar5 = *from1;
                                                    if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
LAB_002279ab:
                                                    iVar2 = strcmp((char *)puVar7,(char *)puVar5);
                                                    if (-1 < iVar2) goto LAB_002279b8;
                                                  }
                                                  }
LAB_002279b8:
                                                  lVar8 = 0;
                                                  do {
                                                    pcVar6 = *(char **)((long)local_68 + lVar8);
                                                    if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                    puVar4 = *local_60;
                                                    if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                    if (0 < iVar2) goto LAB_00227bc6;
                                                    puVar5 = *from1;
                                                    if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                                    if (0 < iVar2) {
                                                      pcVar6 = "cmp(*from0, *from1) <= 0";
                                                      goto LAB_00227c1d;
                                                    }
                                                    if (*local_58 == (uchar *)0x0)
                                                    goto LAB_00227b64;
                                                    iVar2 = strcmp((char *)puVar5,(char *)*local_58)
                                                    ;
                                                    if (0 < iVar2) {
                                                      pcVar6 = "cmp(*from1, *from3) <= 0";
                                                      goto LAB_00227c1d;
                                                    }
                                                    *(char **)((long)local_70 + lVar8) = pcVar6;
                                                    if (local_40 == 1) goto LAB_00227b01;
                                                    pcVar6 = *(char **)((long)local_68 + lVar8 + 8);
                                                    if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                    if (*local_60 == (uchar *)0x0)
                                                    goto LAB_00227b64;
                                                    iVar2 = strcmp(pcVar6,(char *)*local_60);
                                                    lVar8 = lVar8 + 8;
                                                    local_40 = local_40 - 1;
                                                  } while (iVar2 < 0);
                                                  if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                  local_68 = (uchar **)((long)local_68 + lVar8);
                                                  local_70 = (uchar **)((long)local_70 + lVar8);
                                                  iVar2 = strcmp(pcVar6,(char *)*from1);
                                                  if (iVar2 < 0) goto LAB_0022779a;
                                                  if (*local_58 == (uchar *)0x0) goto LAB_00227b64;
                                                  iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                  if (iVar2 < 1) goto LAB_00227acd;
                                                  }
LAB_00227b3f:
                                                  lVar8 = 0;
                                                  do {
                                                    pcVar6 = *(char **)((long)local_60 + lVar8);
                                                    if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                    puVar4 = *from1;
                                                    if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp(pcVar6,(char *)puVar4);
                                                    if (0 < iVar2) goto LAB_00226e94;
                                                    puVar5 = *local_58;
                                                    if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                                    if (0 < iVar2) goto LAB_00227273;
                                                    if (*local_68 == (uchar *)0x0)
                                                    goto LAB_00227b64;
                                                    iVar2 = strcmp((char *)puVar5,(char *)*local_68)
                                                    ;
                                                    if (0 < iVar2) {
                                                      pcVar6 = "cmp(*from3, *from2) <= 0";
                                                      goto LAB_00226e9b;
                                                    }
                                                    *(char **)((long)local_70 + lVar8) = pcVar6;
                                                    ppuVar1 = from1;
                                                    if (n0 == 1) goto LAB_00227711;
                                                    pcVar6 = *(char **)((long)local_60 + lVar8 + 8);
                                                    if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                                    if (*from1 == (uchar *)0x0) goto LAB_00227b64;
                                                    iVar2 = strcmp(pcVar6,(char *)*from1);
                                                    lVar8 = lVar8 + 8;
                                                    n0 = n0 - 1;
                                                  } while (iVar2 < 1);
                                                  if (*local_58 == (uchar *)0x0) goto LAB_00227b64;
                                                  local_60 = (uchar **)((long)local_60 + lVar8);
                                                  local_70 = (uchar **)((long)local_70 + lVar8);
                                                  iVar2 = strcmp(pcVar6,(char *)*local_58);
                                                  } while (iVar2 < 1);
                                                  if (*local_68 == (uchar *)0x0) goto LAB_00227b64;
                                                  iVar2 = strcmp(pcVar6,(char *)*local_68);
                                                  } while (0 < iVar2);
                                                  }
                                                  goto LAB_00226fd8;
                                                  }
                                                  goto LAB_00227b64;
                                                  }
                                                  goto LAB_00226d67;
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00227b64;
                                                  }
                                                  goto LAB_002275f7;
                                                  }
                                                  goto LAB_00227b64;
                                                }
                                                goto LAB_00227acd;
                                              }
                                            }
                                            goto LAB_00227b64;
                                          }
LAB_00226fd8:
                                          lVar8 = 0;
                                          do {
                                            pcVar6 = *(char **)((long)from1 + lVar8);
                                            if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                            puVar4 = *local_58;
                                            if (puVar4 == (uchar *)0x0) goto LAB_00227b64;
                                            iVar2 = strcmp(pcVar6,(char *)puVar4);
                                            if (0 < iVar2) goto LAB_0022724f;
                                            puVar5 = *local_60;
                                            if (puVar5 == (uchar *)0x0) goto LAB_00227b64;
                                            iVar2 = strcmp((char *)puVar4,(char *)puVar5);
                                            if (0 < iVar2) goto LAB_002270f3;
                                            if (*local_68 == (uchar *)0x0) goto LAB_00227b64;
                                            iVar2 = strcmp((char *)puVar5,(char *)*local_68);
                                            if (0 < iVar2) {
                                              pcVar6 = "cmp(*from0, *from2) <= 0";
                                              goto LAB_00226eb3;
                                            }
                                            *(char **)((long)local_70 + lVar8) = pcVar6;
                                            if (local_50 == 1) goto LAB_00227232;
                                            pcVar6 = *(char **)((long)from1 + lVar8 + 8);
                                            if (pcVar6 == (char *)0x0) goto LAB_00227b83;
                                            if (*local_58 == (uchar *)0x0) goto LAB_00227b64;
                                            iVar2 = strcmp(pcVar6,(char *)*local_58);
                                            lVar8 = lVar8 + 8;
                                            local_50 = local_50 - 1;
                                          } while (iVar2 < 1);
                                          if (*local_60 == (uchar *)0x0) goto LAB_00227b64;
                                          from1 = (uchar **)((long)from1 + lVar8);
                                          local_70 = (uchar **)((long)local_70 + lVar8);
                                          iVar2 = strcmp(pcVar6,(char *)*local_60);
                                        } while (iVar2 < 0);
                                        if (*local_68 == (uchar *)0x0) goto LAB_00227b64;
                                        iVar2 = strcmp(pcVar6,(char *)*local_68);
                                        if (0 < iVar2) goto LAB_002274de;
                                        goto LAB_00225bef;
                                      }
                                      goto LAB_002277a2;
                                    }
                                  }
                                }
                              }
                              goto LAB_00227b64;
                            }
                            goto LAB_00225bef;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00227b64;
          }
        }
        else {
          iVar2 = strcmp((char *)__s2,(char *)puVar4);
          puVar7 = *from3;
          if (iVar2 < 0) {
            if (puVar7 != (uchar *)0x0) {
              iVar2 = strcmp((char *)puVar7,(char *)__s2);
              if (iVar2 < 0) goto LAB_0022789f;
              iVar2 = strcmp((char *)puVar7,(char *)puVar4);
              if (iVar2 < 0) goto LAB_002277a2;
              goto LAB_002279ab;
            }
          }
          else if (puVar7 != (uchar *)0x0) {
            iVar2 = strcmp((char *)puVar7,(char *)puVar4);
            if (iVar2 < 0) goto LAB_002274de;
            iVar2 = strcmp((char *)puVar7,(char *)__s2);
            if (iVar2 < 0) goto LAB_0022660f;
            goto LAB_002275ea;
          }
        }
LAB_00227b83:
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x32,"int cmp(const unsigned char *, const unsigned char *)");
      }
    }
    else if (__s2 != (uchar *)0x0) {
      iVar2 = strcmp((char *)puVar5,(char *)__s2);
      if (iVar2 < 1) {
        iVar2 = strcmp((char *)puVar4,(char *)__s2);
        puVar7 = *from3;
        if (iVar2 < 1) {
          if (puVar7 != (uchar *)0x0) {
            iVar2 = strcmp((char *)puVar7,(char *)puVar5);
            if (iVar2 < 0) goto LAB_0022674d;
            iVar2 = strcmp((char *)puVar7,(char *)puVar4);
            if (iVar2 < 0) goto LAB_00226fd8;
            goto LAB_00226858;
          }
        }
        else if (puVar7 != (uchar *)0x0) {
          iVar2 = strcmp((char *)puVar7,(char *)puVar5);
          if (iVar2 < 0) goto LAB_00226286;
          iVar2 = strcmp((char *)puVar7,(char *)__s2);
          if (iVar2 < 0) goto LAB_00227117;
          goto LAB_00226391;
        }
      }
      else {
        puVar7 = *from3;
        if (puVar7 != (uchar *)0x0) {
          iVar2 = strcmp((char *)puVar7,(char *)__s2);
          if (iVar2 < 0) goto LAB_00225e06;
          iVar2 = strcmp((char *)puVar7,(char *)puVar5);
          if (iVar2 < 0) goto LAB_002260de;
          iVar2 = strcmp((char *)puVar7,(char *)puVar4);
          goto joined_r0x00226227;
        }
      }
      goto LAB_00227b83;
    }
  }
LAB_00227b64:
  __assert_fail("b != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x33,"int cmp(const unsigned char *, const unsigned char *)");
LAB_00227738:
  pcVar6 = "cmp(*from3, *from0) <= 0";
  goto LAB_00227763;
LAB_00227ba2:
  pcVar6 = "cmp(*from2, *from3) <= 0";
  goto LAB_00227bd6;
LAB_00226c0b:
  pcVar6 = "cmp(*from1, *from0) <= 0";
  goto LAB_00226c24;
LAB_0022774a:
  pcVar6 = "cmp(*from3, *from1) <= 0";
  goto LAB_00227782;
LAB_00226acc:
  pcVar6 = "cmp(*from0, *from3) <= 0";
  goto LAB_00227c1d;
LAB_00227bab:
  pcVar6 = "cmp(*from3, *from2) <= 0";
  goto LAB_00227bf5;
LAB_00227ad5:
  lVar8 = (long)local_70 + lVar8;
  n1_00 = local_50;
  goto LAB_00227b2b;
LAB_00227b01:
  lVar8 = (long)local_70 + lVar8;
  n1_00 = local_50;
  local_68 = local_58;
  local_40 = local_48;
  goto LAB_00227b2b;
LAB_00226e94:
  pcVar6 = "cmp(*from0, *from1) <= 0";
  goto LAB_00226e9b;
LAB_00227711:
  local_60 = ppuVar1;
  lVar8 = (long)local_70 + lVar8;
  n1_00 = local_40;
  from1 = local_68;
  n0 = local_50;
  local_68 = local_58;
  local_40 = local_48;
  goto LAB_00227b2b;
LAB_0022724f:
  pcVar6 = "cmp(*from1, *from3) <= 0";
  goto LAB_00226eb3;
LAB_00227232:
  lVar8 = (long)local_70 + lVar8;
  n1_00 = local_40;
  from1 = local_68;
  local_68 = local_58;
  local_40 = local_48;
LAB_00227b2b:
  merge_3way(local_60,n0,from1,n1_00,local_68,local_40,(uchar **)(lVar8 + 8));
  return;
LAB_002270f3:
  pcVar6 = "cmp(*from3, *from0) <= 0";
LAB_00226eb3:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b1,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_00227273:
  pcVar6 = "cmp(*from1, *from3) <= 0";
LAB_00226e9b:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1ae,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_00227bc6:
  pcVar6 = "cmp(*from2, *from0) <= 0";
LAB_00227c1d:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b2,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_00227bbd:
  pcVar6 = "cmp(*from2, *from0) <= 0";
LAB_00227bf5:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b5,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_00226729:
  pcVar6 = "cmp(*from0, *from3) <= 0";
LAB_00227782:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1af,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_00226c14:
  pcVar6 = "cmp(*from0, *from3) <= 0";
LAB_00226c24:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b0,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_00227bb4:
  pcVar6 = "cmp(*from3, *from0) <= 0";
LAB_00227bd6:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b3,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_00227741:
  pcVar6 = "cmp(*from0, *from2) <= 0";
LAB_00227763:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b4,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
}

Assistant:

static void
merge_4way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict from2, size_t n2,
           unsigned char** restrict from3, size_t n3,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2
	       <<", n3="<<n3<<"\n";
	if (cmp(*from0, *from1) <= 0) {
		if (cmp(*from1, *from2) <= 0) {
			/* 0 <= 1 <= 2 */
			if (cmp(*from3, *from0) < 0) goto state_3012;
			if (cmp(*from3, *from1) < 0) goto state_0312;
			if (cmp(*from3, *from2) < 0) goto state_0132;
			goto state_0123;
		}
		if (cmp(*from2, *from0) < 0) {
			/* 2 < 0 <= 1 */
			if (cmp(*from3, *from2) < 0) goto state_3201;
			if (cmp(*from3, *from0) < 0) goto state_2301;
			if (cmp(*from3, *from1) < 0) goto state_2031;
			goto state_2013;
		}
		/* 0 <= 2 < 1 */
		if (cmp(*from3, *from0) < 0) goto state_3021;
		if (cmp(*from3, *from2) < 0) goto state_0321;
		if (cmp(*from3, *from1) < 0) goto state_0231;
		goto state_0213;
	}
	if (cmp(*from1, *from2) <= 0) {
		if (cmp(*from0, *from2) <= 0) {
			/* 1 < 0 <= 2 */
			if (cmp(*from3, *from1) < 0) goto state_3102;
			if (cmp(*from3, *from0) < 0) goto state_1302;
			if (cmp(*from3, *from2) < 0) goto state_1032;
			goto state_1023;
		}
		/* 1 <= 2 < 0 */
		if (cmp(*from3, *from1) < 0) goto state_3120;
		if (cmp(*from3, *from2) < 0) goto state_1320;
		if (cmp(*from3, *from0) < 0) goto state_1230;
		goto state_1203;
	}
	/* 2 < 1 < 0 */
	if (cmp(*from3, *from2) < 0) goto state_3210;
	if (cmp(*from3, *from1) < 0) goto state_2310;
	if (cmp(*from3, *from0) < 0) goto state_2130;
	goto state_2103;

#define MAKE_STATE(a,b,c,d)                                                    \
        state_ ## a ## b ## c ## d:                                            \
        assert(cmp(*from ## a, *from ## b) <= 0);                              \
        assert(cmp(*from ## b, *from ## c) <= 0);                              \
        assert(cmp(*from ## c, *from ## d) <= 0);                              \
        *result++ = *from ## a ++;                                             \
        if (--n ## a == 0) goto finish ## a ;                                  \
        if (a < b) if (cmp(*from##a, *from##b) <= 0) goto state_##a##b##c##d;  \
        if (a > b) if (cmp(*from##a, *from##b) <  0) goto state_##a##b##c##d;  \
        if (a < c) if (cmp(*from##a, *from##c) <= 0) goto state_##b##a##c##d;  \
        if (a > c) if (cmp(*from##a, *from##c) <  0) goto state_##b##a##c##d;  \
        if (a < d) if (cmp(*from##a, *from##d) <= 0) goto state_##b##c##a##d;  \
        if (a > d) if (cmp(*from##a, *from##d) <  0) goto state_##b##c##a##d;  \
        goto state_ ## b ## c ## d ## a;

	MAKE_STATE(0, 1, 2, 3); MAKE_STATE(0, 1, 3, 2); MAKE_STATE(0, 2, 1, 3);
	MAKE_STATE(0, 2, 3, 1); MAKE_STATE(0, 3, 1, 2); MAKE_STATE(0, 3, 2, 1);
	MAKE_STATE(1, 0, 2, 3); MAKE_STATE(1, 0, 3, 2); MAKE_STATE(1, 2, 0, 3);
	MAKE_STATE(1, 2, 3, 0); MAKE_STATE(1, 3, 0, 2); MAKE_STATE(1, 3, 2, 0);
	MAKE_STATE(2, 0, 1, 3); MAKE_STATE(2, 0, 3, 1); MAKE_STATE(2, 1, 0, 3);
	MAKE_STATE(2, 1, 3, 0); MAKE_STATE(2, 3, 0, 1); MAKE_STATE(2, 3, 1, 0);
	MAKE_STATE(3, 0, 1, 2); MAKE_STATE(3, 0, 2, 1); MAKE_STATE(3, 1, 0, 2);
	MAKE_STATE(3, 1, 2, 0); MAKE_STATE(3, 2, 0, 1); MAKE_STATE(3, 2, 1, 0);
#undef MAKE_STATE

finish0:
	assert(n0 == 0);
	merge_3way(from1, n1, from2, n2, from3, n3, result);
	return;
finish1:
	assert(n1 == 0);
	merge_3way(from0, n0, from2, n2, from3, n3, result);
	return;
finish2:
	assert(n2 == 0);
	merge_3way(from0, n0, from1, n1, from3, n3, result);
	return;
finish3:
	assert(n3 == 0);
	merge_3way(from0, n0, from1, n1, from2, n2, result);
	return;
}